

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O3

Clause * __thiscall Inferences::DistinctnessISE::simplify(DistinctnessISE *this,Clause *c)

{
  Literal *lit;
  bool bVar1;
  ulong uVar2;
  SimplifyingInference1 local_58;
  Inference local_48;
  
  if (((c->super_Unit)._inference.field_0x2 & 2) == 0) {
    uVar2 = (ulong)((uint)*(undefined8 *)&c->field_0x38 & 0xfffff);
    do {
      if ((long)uVar2 < 1) {
        return c;
      }
      lit = c->_literals[uVar2 - 1];
      uVar2 = uVar2 - 1;
      bVar1 = distinctConstructorsEquality(lit);
    } while (!bVar1);
    if (((lit->super_Term)._args[0]._content & 4) == 0) {
      *(int *)(DAT_00b521c0 + 0x1c0) = *(int *)(DAT_00b521c0 + 0x1c0) + 1;
      c = (Clause *)0x0;
    }
    else {
      local_58.rule = TERM_ALGEBRA_DISTINCTNESS;
      local_58.premise = c;
      Kernel::Inference::Inference(&local_48,&local_58);
      c = removeLit(c,(uint)uVar2,&local_48);
      *(int *)(DAT_00b521c0 + 0x1bc) = *(int *)(DAT_00b521c0 + 0x1bc) + 1;
    }
  }
  return c;
}

Assistant:

Clause* DistinctnessISE::simplify(Clause* c)
  {
    if (c->isPureTheoryDescendant())
      return c;
    
    int length = c->length();
    for (int i = length - 1; i >= 0; i--) {
      Literal *lit = (*c)[i];
      if (distinctConstructorsEquality(lit)) {
        if (lit->isPositive()) {
          // equality of the form f(x) = g(y), delete literal from clause
          Clause* res = removeLit(c, i, SimplifyingInference1(InferenceRule::TERM_ALGEBRA_DISTINCTNESS, c));
          env.statistics->taDistinctnessSimplifications++;
          return res;
        } else {
          // inequality of the form f(x) != g(y) are theory tautologies
          env.statistics->taDistinctnessTautologyDeletions++;
          return 0;
        }
      }
    }

    // no equalities between distinct constructors were found
    return c;
  }